

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O2

ares_status_t ares_uri_set_query_key(ares_uri_t *uri,char *key,char *val)

{
  ares_bool_t aVar1;
  size_t sVar2;
  ares_status_t aVar3;
  
  aVar3 = ARES_EFORMERR;
  if ((key != (char *)0x0 && uri != (ares_uri_t *)0x0) && (*key != '\0')) {
    sVar2 = ares_strlen(key);
    aVar1 = ares_str_isprint(key,sVar2);
    aVar3 = ARES_EBADSTR;
    if (aVar1 != ARES_FALSE) {
      if (val != (char *)0x0) {
        sVar2 = ares_strlen(val);
        aVar1 = ares_str_isprint(val,sVar2);
        if (aVar1 == ARES_FALSE) {
          return ARES_EBADSTR;
        }
      }
      aVar1 = ares_htable_dict_insert(uri->query,key,val);
      aVar3 = ARES_ENOMEM;
      if (aVar1 != ARES_FALSE) {
        aVar3 = ARES_SUCCESS;
      }
    }
  }
  return aVar3;
}

Assistant:

ares_status_t ares_uri_set_query_key(ares_uri_t *uri, const char *key,
                                     const char *val)
{
  if (uri == NULL || key == NULL || *key == 0) {
    return ARES_EFORMERR;
  }

  if (!ares_str_isprint(key, ares_strlen(key)) ||
      (val != NULL && !ares_str_isprint(val, ares_strlen(val)))) {
    return ARES_EBADSTR;
  }

  if (!ares_htable_dict_insert(uri->query, key, val)) {
    return ARES_ENOMEM;
  }
  return ARES_SUCCESS;
}